

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall Benchmark<ClockRecovery>::fillQueue(Benchmark<ClockRecovery> *this)

{
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  undefined1 local_20 [16];
  
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
            ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
             local_20);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_20._0_8_,
             (long)this->blockSize_);
  local_20._8_8_ = local_20._0_8_;
  local_20._0_8_ = 0;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
            ((this->inQueue_).
             super___shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                      *)(local_20 + 8));
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)(local_20 + 8));
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)local_20);
  return;
}

Assistant:

void fillQueue() {
    auto input = inQueue_->popForWrite();
    input->resize(blockSize_);
    inQueue_->pushWrite(std::move(input));
  }